

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_footprints.cpp
# Opt level: O0

void __thiscall
cp::PlanFootprints::setValues
          (PlanFootprints *this,walking_state wstate,rl swingleg,Vector3 *land_pos)

{
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pCVar1;
  Scalar *pSVar2;
  Scalar local_90;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_88;
  Scalar local_68 [3];
  Scalar local_50;
  Scalar local_48;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_40;
  Vector3 *local_20;
  Vector3 *land_pos_local;
  rl swingleg_local;
  walking_state wstate_local;
  PlanFootprints *this_local;
  
  *(walking_state *)(this + 0x308) = wstate;
  *(rl *)(this + 0x2e0) = swingleg;
  local_20 = land_pos;
  land_pos_local._0_4_ = swingleg;
  land_pos_local._4_4_ = wstate;
  _swingleg_local = this;
  if (wstate == stopping1) {
    local_48 = 0.0;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator<<
              (&local_40,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)land_pos,&local_48);
    local_50 = 0.0;
    pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                       (&local_40,&local_50);
    local_68[0] = 0.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(pCVar1,local_68);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_40);
  }
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::x
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)land_pos);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator<<
            (&local_88,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)(this + 0x2e8),pSVar2);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::y
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)land_pos);
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                     (&local_88,pSVar2);
  local_90 = 0.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(pCVar1,&local_90);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_88);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::z
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)land_pos);
  *(Scalar *)(this + 0x300) = *pSVar2;
  return;
}

Assistant:

void PlanFootprints::setValues(walking_state wstate, rl swingleg,
                               Vector3 land_pos) {
  this->wstate = wstate;
  this->swingleg = swingleg;
  if (wstate == stopping1) { land_pos << 0.0, 0.0, 0.0; }
  step_vector << land_pos.x(), land_pos.y(), 0.0;
  step_angle = land_pos.z();
}